

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFEncoder.cpp
# Opt level: O0

BarcodeMatrix * __thiscall
ZXing::Pdf417::Encoder::generateBarcodeLogic(Encoder *this,wstring *msg,int errorCorrectionLevel)

{
  int iVar1;
  int iVar2;
  int iVar3;
  invalid_argument *piVar4;
  iterator iVar5;
  int in_ECX;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_RDI;
  int i;
  vector<int,_std::allocator<int>_> dataCodewords;
  int n;
  int pad;
  int rows;
  int cols;
  int sourceCodeWords;
  vector<int,_std::allocator<int>_> highLevel;
  int errorCorrectionCodeWords;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffef0;
  vector<int,_std::allocator<int>_> *this_01;
  value_type_conflict3 *in_stack_fffffffffffffef8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff00;
  vector<int,_std::allocator<int>_> *this_02;
  undefined8 in_stack_ffffffffffffff10;
  size_type in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  undefined4 in_stack_ffffffffffffff30;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffff38;
  const_iterator __position;
  int local_a4;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar6;
  int local_54;
  int in_stack_ffffffffffffffb0;
  Compaction in_stack_ffffffffffffffb4;
  wstring *in_stack_ffffffffffffffb8;
  
  if ((-1 < in_ECX) && (in_ECX < 9)) {
    __position._M_current = in_RDI._M_current;
    iVar1 = GetErrorCorrectionCodewordCount(in_ECX);
    HighLevelEncoder::EncodeHighLevel
              (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
               (CharacterSet)((uint)in_stack_ffffffffffffffb0 >> 0x18));
    iVar2 = Size<std::vector<int,std::allocator<int>>>(in_stack_fffffffffffffef0);
    this_01 = (vector<int,_std::allocator<int>_> *)&local_54;
    this_00 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffb0;
    iVar6 = iVar2;
    DetermineDimensions(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20,
                        (int)(in_stack_ffffffffffffff18 >> 0x20),(int)in_stack_ffffffffffffff18,
                        (int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
                        (int)in_stack_ffffffffffffff10,
                        (int *)CONCAT44(iVar2,in_stack_ffffffffffffff30),
                        in_stack_ffffffffffffff38._M_current);
    iVar3 = GetNumberOfPadCodewords(iVar6,iVar1,in_stack_ffffffffffffffb0,local_54);
    if (0x3a1 < iVar6 + iVar1 + 1) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument
                (piVar4,"Encoded message contains to many code words, message too big");
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    iVar6 = iVar6 + 1 + iVar3;
    iVar1 = iVar3;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2d80ff);
    std::vector<int,_std::allocator<int>_>::reserve
              ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar1,in_stack_ffffffffffffff20),
               in_stack_ffffffffffffff18);
    std::vector<int,_std::allocator<int>_>::push_back
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    this_02 = (vector<int,_std::allocator<int>_> *)&stack0xffffffffffffff88;
    iVar5 = std::vector<int,_std::allocator<int>_>::end(this_00);
    __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
    __normal_iterator<int*>
              ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_01,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00);
    std::vector<int,_std::allocator<int>_>::begin(this_00);
    std::vector<int,_std::allocator<int>_>::end(this_00);
    std::vector<int,std::allocator<int>>::
    insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
              ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar2,in_stack_ffffffffffffff30),
               __position,in_RDI,in_stack_ffffffffffffff38);
    for (local_a4 = 0; local_a4 < iVar3; local_a4 = local_a4 + 1) {
      std::vector<int,_std::allocator<int>_>::push_back(this_01,(value_type_conflict3 *)this_00);
    }
    GenerateErrorCorrection
              ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar6,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
    EncodeLowLevel(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,
                   (int)((ulong)iVar5._M_current >> 0x20),SUB81((ulong)iVar5._M_current >> 0x18,0));
    std::vector<int,_std::allocator<int>_>::~vector(this_02);
    std::vector<int,_std::allocator<int>_>::~vector(this_02);
    return (BarcodeMatrix *)__position._M_current;
  }
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar4,"Error correction level must be between 0 and 8!");
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

BarcodeMatrix
Encoder::generateBarcodeLogic(const std::wstring& msg, int errorCorrectionLevel) const
{
	if (errorCorrectionLevel < 0 || errorCorrectionLevel > 8) {
		throw std::invalid_argument("Error correction level must be between 0 and 8!");
	}

	//1. step: High-level encoding
	int errorCorrectionCodeWords = GetErrorCorrectionCodewordCount(errorCorrectionLevel);
	std::vector<int> highLevel = HighLevelEncoder::EncodeHighLevel(msg, _compaction, _encoding);
	
	int sourceCodeWords = Size(highLevel);

	int cols, rows;
	DetermineDimensions(_minCols, _maxCols, _minRows, _maxRows, sourceCodeWords, errorCorrectionCodeWords, cols, rows);

	int pad = GetNumberOfPadCodewords(sourceCodeWords, errorCorrectionCodeWords, cols, rows);

	//2. step: construct data codewords
	if (sourceCodeWords + errorCorrectionCodeWords + 1 > 929) { // +1 for symbol length CW
		throw std::invalid_argument("Encoded message contains to many code words, message too big");
	}
	int n = sourceCodeWords + pad + 1;
	std::vector<int> dataCodewords;
	dataCodewords.reserve(n);
	dataCodewords.push_back(n);
	dataCodewords.insert(dataCodewords.end(), highLevel.begin(), highLevel.end());
	for (int i = 0; i < pad; i++) {
		dataCodewords.push_back(900); //PAD characters
	}

	//3. step: Error correction
	GenerateErrorCorrection(dataCodewords, errorCorrectionLevel);

	//4. step: low-level encoding
	return EncodeLowLevel(dataCodewords, cols, rows, errorCorrectionLevel, _compact);
}